

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

bool __thiscall slang::SourceManager::isMacroLoc(SourceManager *this,SourceLocation location)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  const_reference __ptr;
  add_pointer_t<const_slang::SourceManager::ExpansionInfo> ptVar4;
  undefined1 local_40 [8];
  shared_lock<std::shared_mutex> lock;
  BufferID local_28;
  BufferID buffer;
  SourceManager *this_local;
  SourceLocation location_local;
  
  this_local = (SourceManager *)location;
  buffer = SourceLocation::buffer((SourceLocation *)&this_local);
  local_28 = SourceLocation::buffer((SourceLocation *)&SourceLocation::NoLocation);
  bVar1 = BufferID::operator==(&buffer,&local_28);
  if (bVar1) {
    location_local._7_1_ = 0;
  }
  else {
    lock._12_4_ = SourceLocation::buffer((SourceLocation *)&this_local);
    bVar1 = BufferID::operator_cast_to_bool((BufferID *)&lock.field_0xc);
    if (bVar1) {
      std::shared_lock<std::shared_mutex>::shared_lock
                ((shared_lock<std::shared_mutex> *)local_40,&this->mut);
      uVar2 = BufferID::getId((BufferID *)&lock.field_0xc);
      sVar3 = std::
              vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
              ::size(&this->bufferEntries);
      if (sVar3 <= uVar2) {
        assert::assertFailed
                  ("buffer.getId() < bufferEntries.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                   ,0x95,"bool slang::SourceManager::isMacroLoc(SourceLocation) const");
      }
      uVar2 = BufferID::getId((BufferID *)&lock.field_0xc);
      __ptr = std::
              vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
              ::operator[](&this->bufferEntries,(ulong)uVar2);
      ptVar4 = std::
               get_if<slang::SourceManager::ExpansionInfo,slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>
                         (__ptr);
      location_local._7_1_ = ptVar4 != (add_pointer_t<const_slang::SourceManager::ExpansionInfo>)0x0
      ;
      std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_40);
    }
    else {
      location_local._7_1_ = 0;
    }
  }
  return (bool)(location_local._7_1_ & 1);
}

Assistant:

bool SourceManager::isMacroLoc(SourceLocation location) const {
    if (location.buffer() == SourceLocation::NoLocation.buffer())
        return false;

    auto buffer = location.buffer();
    if (!buffer)
        return false;

    std::shared_lock lock(mut);

    ASSERT(buffer.getId() < bufferEntries.size());
    return std::get_if<ExpansionInfo>(&bufferEntries[buffer.getId()]) != nullptr;
}